

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O0

int __thiscall QColor::hsvSaturation(QColor *this)

{
  int *in_RDI;
  long in_FS_OFFSET;
  undefined4 local_2c;
  QColor *this_00;
  
  this_00 = *(QColor **)(in_FS_OFFSET + 0x28);
  if ((*in_RDI == 0) || (*in_RDI == 2)) {
    local_2c = qt_div_257(0);
  }
  else {
    toHsv(this_00);
    local_2c = saturation((QColor *)0x4ac55e);
  }
  if (*(QColor **)(in_FS_OFFSET + 0x28) == this_00) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

int QColor::hsvSaturation() const noexcept
{
    if (cspec != Invalid && cspec != Hsv)
        return toHsv().saturation();
    return qt_div_257(ct.ahsv.saturation);
}